

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectlight.cpp
# Opt level: O1

double __thiscall RectLight::getShadowRatio(RectLight *this,Scene *scene,Vector3 *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int j;
  int iVar6;
  pointer ppOVar7;
  uint uVar8;
  double x;
  Vector3 dir;
  Vector3 c;
  Collision coll;
  Vector3 local_f8;
  Vector3 local_e0;
  Vector3 local_c8;
  Vector3 local_b0 [4];
  double local_40;
  
  iVar4 = 0;
  dVar3 = 0.0;
  iVar5 = 0x10;
  do {
    dVar2 = 0.0;
    iVar6 = 0;
    do {
      Vector3::operator*(&local_e0,&this->m_dx,(dVar3 + 0.5 + dVar3 + 0.5) * 0.25 + -1.0);
      operator+(&this->m_o,&local_e0);
      Vector3::operator*(&local_f8,&this->m_dy,(dVar2 + 0.5 + dVar2 + 0.5) * 0.25 + -1.0);
      operator+(local_b0,&local_f8);
      operator-(&local_c8,p);
      dVar1 = Vector3::mod(&local_e0);
      for (ppOVar7 = (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppOVar7 !=
          (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppOVar7 = ppOVar7 + 1) {
        (*(*ppOVar7)->_vptr_Object[2])(local_b0,*ppOVar7,p,&local_e0);
        uVar8 = -(uint)(local_40 < 1000000000.0 && local_40 + 1e-06 < dVar1);
        iVar5 = uVar8 + iVar5;
        if ((uVar8 & 1) != 0) break;
      }
      dVar2 = dVar2 + 1.0;
      iVar6 = iVar6 + 1;
    } while (iVar6 != 4);
    dVar3 = dVar3 + 1.0;
    iVar4 = iVar4 + 1;
    if (iVar4 == 4) {
      return (double)iVar5 * 0.25 * 0.25;
    }
  } while( true );
}

Assistant:

double RectLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    int ret = SHADOW_SAMPLE * SHADOW_SAMPLE;
    for (int i = 0; i < SHADOW_SAMPLE; i++)
        for (int j = 0; j < SHADOW_SAMPLE; j++)
        {
            double x = (i + 0.5) * 2 / SHADOW_SAMPLE - 1,
                   y = (j + 0.5) * 2 / SHADOW_SAMPLE - 1;
            Vector3 c = m_o + m_dx * x + m_dy * y, dir = c - p;
            double dist = dir.mod();

            for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
            {
                Collision coll = (*o)->collide(p, dir);
                if (coll.isHit() && coll.dist + Const::EPS < dist)
                {
                    ret--;
                    break;
                }
            }
        }
    return 1.0 * ret / SHADOW_SAMPLE / SHADOW_SAMPLE;
}